

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O1

void __thiscall libtorrent::aux::part_file::~part_file(part_file *this)

{
  pointer psVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  error_code ec;
  error_code local_18;
  
  local_18.val_ = 0;
  local_18.failed_ = false;
  local_18.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  flush_metadata_impl(this,&local_18);
  ::std::
  _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_piece_map)._M_h);
  psVar1 = (this->m_free_slots).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->m_free_slots).
                                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  paVar3 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_path)._M_dataplus._M_p;
  paVar3 = &(this->m_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

part_file::~part_file()
	{
		error_code ec;
		flush_metadata_impl(ec);
	}